

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_adaptor_sig_verify
              (secp256k1_context *ctx,uchar *adaptor_sig65,secp256k1_pubkey *pubkey,uchar *msg32,
              secp256k1_pubkey *adaptor,uchar *adaptor_proof97)

{
  int iVar1;
  secp256k1_fe *rzr;
  void *pvVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  secp256k1_ge *in_stack_fffffffffffffa48;
  secp256k1_scalar dleq_proof_s;
  secp256k1_scalar sigr;
  secp256k1_scalar sp;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar e_neg;
  secp256k1_ge rp;
  secp256k1_ge r;
  secp256k1_gej lhs;
  secp256k1_scalar msg;
  secp256k1_scalar e_expected;
  secp256k1_ge rhs;
  secp256k1_ge q;
  secp256k1_ge adaptor_ge;
  secp256k1_ge r1;
  secp256k1_gej local_188;
  secp256k1_ge r2;
  secp256k1_gej r2j;
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)";
  }
  else if (adaptor_sig65 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "adaptor_sig65 != NULL";
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "pubkey != NULL";
  }
  else if (msg32 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "msg32 != NULL";
  }
  else if (adaptor == (secp256k1_pubkey *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "adaptor != NULL";
  }
  else {
    if (adaptor_proof97 != (uchar *)0x0) {
      iVar1 = secp256k1_dleq_deserialize_point(&rp,adaptor_proof97);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_set_b32(&dleq_proof_s,adaptor_proof97 + 0x21,(int *)&lhs);
      if ((int)lhs.x.n[0] != 0) {
        return 0;
      }
      secp256k1_scalar_set_b32(&dleq_proof_e,adaptor_proof97 + 0x41,(int *)&lhs);
      if ((int)lhs.x.n[0] != 0) {
        return 0;
      }
      iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize(&r,&sigr,&sp,adaptor_sig65);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_pubkey_load(ctx,&adaptor_ge,adaptor);
      if (iVar1 == 0) {
        return 0;
      }
      q.x.n[0] = rp.x.n[0];
      q.x.n[1] = rp.x.n[1];
      q.x.n[2] = rp.x.n[2];
      q.x.n[3] = rp.x.n[3];
      q.x.n[4] = rp.x.n[4];
      q.y.n[0] = rp.y.n[0];
      q.y.n[1] = rp.y.n[1];
      q.y.n[2] = rp.y.n[2];
      q.y.n[3] = rp.y.n[3];
      q.y.n[4] = rp.y.n[4];
      q.infinity = 1;
      q._84_4_ = 0;
      rhs.x.n[4] = r.x.n[4];
      rhs.x.n[2] = r.x.n[2];
      rhs.x.n[3] = r.x.n[3];
      rhs.x.n[0] = r.x.n[0];
      rhs.x.n[1] = r.x.n[1];
      rhs.y.n[4] = r.y.n[4];
      rhs.y.n[2] = r.y.n[2];
      rhs.y.n[3] = r.y.n[3];
      rhs.y.n[0] = r.y.n[0];
      rhs.y.n[1] = r.y.n[1];
      rhs.infinity = 1;
      rhs._84_4_ = 0;
      secp256k1_scalar_negate(&e_neg,&dleq_proof_e);
      secp256k1_ecmult(&ctx->ecmult_ctx,(secp256k1_gej *)&msg,(secp256k1_gej *)&q,&e_neg,
                       &dleq_proof_s);
      secp256k1_ecmult(&ctx->ecmult_ctx,&local_188,(secp256k1_gej *)&rhs,&e_neg,
                       &secp256k1_scalar_zero);
      lhs.infinity = adaptor_ge.infinity;
      lhs.x.n[0] = adaptor_ge.x.n[0];
      lhs.x.n[1] = adaptor_ge.x.n[1];
      lhs.x.n[2] = adaptor_ge.x.n[2];
      lhs.x.n[3] = adaptor_ge.x.n[3];
      lhs.x.n[4] = adaptor_ge.x.n[4];
      lhs.y.n[0] = adaptor_ge.y.n[0];
      lhs.y.n[1] = adaptor_ge.y.n[1];
      lhs.y.n[2] = adaptor_ge.y.n[2];
      lhs.y.n[3] = adaptor_ge.y.n[3];
      lhs.y.n[4] = adaptor_ge.y.n[4];
      lhs.z.n[0] = 1;
      lhs.z.n._8_16_ = ZEXT816(0);
      lhs.z.n._24_16_ = ZEXT816(0);
      rzr = (secp256k1_fe *)&dleq_proof_s;
      secp256k1_ecmult(&ctx->ecmult_ctx,&r2j,&lhs,(secp256k1_scalar *)rzr,&secp256k1_scalar_zero);
      secp256k1_gej_add_var(&r2j,&r2j,&local_188,rzr);
      secp256k1_ge_set_gej(&r1,(secp256k1_gej *)&msg);
      secp256k1_ge_set_gej(&r2,&r2j);
      secp256k1_dleq_challenge_hash
                (&e_expected,(uchar *)&adaptor_ge,&r1,&r2,&rp,&r,in_stack_fffffffffffffa48);
      iVar1 = secp256k1_scalar_add(&e_expected,&e_expected,&e_neg);
      auVar4._0_4_ = -(uint)((int)e_expected.d[2] == 0 && (int)e_expected.d[0] == 0);
      auVar4._4_4_ = -(uint)(e_expected.d[2]._4_4_ == 0 && e_expected.d[0]._4_4_ == 0);
      auVar4._8_4_ = -(uint)((int)e_expected.d[3] == 0 && (int)e_expected.d[1] == 0);
      auVar4._12_4_ = -(uint)(e_expected.d[3]._4_4_ == 0 && e_expected.d[1]._4_4_ == 0);
      iVar1 = movmskps(iVar1,auVar4);
      if (iVar1 != 0xf) {
        return 0;
      }
      secp256k1_scalar_set_b32(&msg,msg32,(int *)0x0);
      iVar1 = secp256k1_pubkey_load(ctx,&q,pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_ecdsa_adaptor_sig_verify_helper(ctx,&rhs,&sigr,&sp,&q,&msg);
      if (iVar1 != 0) {
        lhs.infinity = rp.infinity;
        lhs.x.n[0] = rp.x.n[0];
        lhs.x.n[1] = rp.x.n[1];
        lhs.x.n[2] = rp.x.n[2];
        lhs.x.n[3] = rp.x.n[3];
        lhs.x.n[4] = rp.x.n[4];
        lhs.y.n[0] = rp.y.n[0];
        lhs.y.n[1] = rp.y.n[1];
        lhs.y.n[2] = rp.y.n[2];
        lhs.y.n[3] = rp.y.n[3];
        lhs.y.n[4] = rp.y.n[4];
        lhs.z.n[0] = 1;
        lhs.z.n[1] = 0;
        lhs.z.n[2] = 0;
        lhs.z.n[3] = 0;
        lhs.z.n[4] = 0;
        secp256k1_ge_neg(&rhs,&rhs);
        secp256k1_gej_add_ge_var(&lhs,&lhs,&rhs,(secp256k1_fe *)0x0);
        return lhs.infinity;
      }
      return 0;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "adaptor_proof97 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_sig_verify(const secp256k1_context* ctx, const unsigned char *adaptor_sig65, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_pubkey *adaptor, const unsigned char *adaptor_proof97) {
    secp256k1_scalar dleq_proof_s, dleq_proof_e;
    secp256k1_scalar msg;
    secp256k1_ge q;
    secp256k1_ge r, rp;
    secp256k1_scalar sp;
    secp256k1_scalar sigr;
    secp256k1_ge adaptor_ge;
    secp256k1_ge rhs;
    secp256k1_gej lhs;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(adaptor_sig65 != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(adaptor != NULL);
    ARG_CHECK(adaptor_proof97 != NULL);

    /* 1. DLEQ_verify((G,R'),(Y, R)) */
    if (!secp256k1_ecdsa_adaptor_proof_deserialize(&rp, &dleq_proof_s, &dleq_proof_e, adaptor_proof97)) {
        return 0;
    }
    if (!secp256k1_ecdsa_adaptor_sig_deserialize(&r, &sigr, &sp, adaptor_sig65)) {
        return 0;
    }
    if (!secp256k1_pubkey_load(ctx, &adaptor_ge, adaptor)) {
        return 0;
    }
    if(!secp256k1_dleq_verify(&ctx->ecmult_ctx, (unsigned char *)"ECDSAAdaptorSig", &dleq_proof_s, &dleq_proof_e, &rp, &adaptor_ge, &r)) {
        return 0;
    }

    /* 2. return x_coord(R') == x_coord(s'⁻¹(H(m) * G + x_coord(R) * X)) */
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    if (!secp256k1_pubkey_load(ctx, &q, pubkey)) {
        return 0;
    }
    if (!secp256k1_ecdsa_adaptor_sig_verify_helper(ctx, &rhs, &sigr, &sp, &q, &msg)) {
        return 0;
    }

    secp256k1_gej_set_ge(&lhs, &rp);
    secp256k1_ge_neg(&rhs, &rhs);
    secp256k1_gej_add_ge_var(&lhs, &lhs, &rhs, NULL);
    return secp256k1_gej_is_infinity(&lhs);
}